

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QGraphicsAnchorLayout::removeAt(QGraphicsAnchorLayout *this,int index)

{
  QGraphicsAnchorLayoutPrivate *this_00;
  QGraphicsLayoutItem *item;
  char *__filename;
  
  this_00 = (QGraphicsAnchorLayoutPrivate *)
            (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
  __filename = (char *)(long)index;
  if ((__filename < (char *)(this_00->items).d.size) &&
     (item = (this_00->items).d.ptr[(long)__filename], item != (QGraphicsLayoutItem *)0x0)) {
    QGraphicsAnchorLayoutPrivate::removeCenterConstraints(this_00,item,Horizontal);
    QGraphicsAnchorLayoutPrivate::removeCenterConstraints(this_00,item,Vertical);
    QGraphicsAnchorLayoutPrivate::removeAnchors(this_00,item);
    QList<QGraphicsLayoutItem_*>::remove(&this_00->items,__filename);
    QGraphicsLayoutItem::setParentLayoutItem(item,(QGraphicsLayoutItem *)0x0);
    (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])(this);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }